

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void change_special_filename(bool filename_is_code,string *filename)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,filename_is_code) == 0) {
    iVar1 = std::__cxx11::string::compare((char *)filename);
    if (iVar1 != 0) {
      return;
    }
    pcVar3 = (char *)filename->_M_string_length;
    pcVar2 = "<stdin>";
  }
  else {
    pcVar3 = (char *)filename->_M_string_length;
    pcVar2 = "<cmdline>";
  }
  std::__cxx11::string::_M_replace((ulong)filename,0,pcVar3,(ulong)pcVar2);
  return;
}

Assistant:

void change_special_filename(bool filename_is_code, std::string *filename)
{
    if (filename_is_code) {
        *filename = "<cmdline>";
    } else if (*filename == "-") {
        *filename = "<stdin>";
    }
}